

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_ssl_cert
          (torrent *this,string *certificate,string *private_key,string *dh_params,
          string *passphrase)

{
  bool bVar1;
  uint uVar2;
  alert_manager *paVar3;
  pointer pcVar4;
  undefined8 uVar5;
  string local_128;
  undefined1 local_108 [16];
  string local_f8;
  undefined1 local_d8 [16];
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [48];
  undefined1 local_68 [8];
  error_code ec;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_44;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_30;
  string *passphrase_local;
  string *dh_params_local;
  string *private_key_local;
  string *certificate_local;
  torrent *this_local;
  
  local_30._M_head_impl = (hash_picker *)passphrase;
  passphrase_local = dh_params;
  dh_params_local = private_key;
  private_key_local = certificate;
  certificate_local = (string *)this;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_ssl_ctx);
  if (bVar1) {
    boost::system::error_code::error_code((error_code *)local_68);
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    ::std::__cxx11::string::string((string *)(local_98 + 0x10),(string *)local_30._M_head_impl);
    boost::asio::ssl::context::
    set_password_callback<libtorrent::aux::torrent::set_ssl_cert(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
              (pcVar4,(anon_class_32_1_de293bc8_for_callback_ *)(local_98 + 0x10),
               (error_code *)local_68);
    set_ssl_cert(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::~__0((__0 *)(local_98 + 0x10));
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
    if (bVar1) {
      paVar3 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
      if (bVar1) {
        paVar3 = alerts(this);
        get_handle((torrent *)local_98);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[1]>
                  (paVar3,(torrent_handle *)local_98,(error_code *)local_68,(char (*) [1])0x86a1ad);
        torrent_handle::~torrent_handle((torrent_handle *)local_98);
      }
    }
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_certificate_file
              (pcVar4,private_key_local,pem,(error_code *)local_68);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
    if (bVar1) {
      paVar3 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
      if (bVar1) {
        paVar3 = alerts(this);
        get_handle((torrent *)local_a8);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  (paVar3,(torrent_handle *)local_a8,(error_code *)local_68,private_key_local);
        torrent_handle::~torrent_handle((torrent_handle *)local_a8);
      }
    }
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar2 & 1) != 0) {
      boost::system::error_code::message_abi_cxx11_
                ((string *)(local_d8 + 0x10),(error_code *)local_68);
      uVar5 = ::std::__cxx11::string::c_str();
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** use certificate file: %s",uVar5);
      ::std::__cxx11::string::~string((string *)(local_d8 + 0x10));
    }
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_private_key_file
              (pcVar4,dh_params_local,pem,(error_code *)local_68);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
    if (bVar1) {
      paVar3 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
      if (bVar1) {
        paVar3 = alerts(this);
        get_handle((torrent *)local_d8);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  (paVar3,(torrent_handle *)local_d8,(error_code *)local_68,dh_params_local);
        torrent_handle::~torrent_handle((torrent_handle *)local_d8);
      }
    }
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar2 & 1) != 0) {
      boost::system::error_code::message_abi_cxx11_
                ((string *)(local_108 + 0x10),(error_code *)local_68);
      uVar5 = ::std::__cxx11::string::c_str();
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** use private key file: %s",uVar5);
      ::std::__cxx11::string::~string((string *)(local_108 + 0x10));
    }
    pcVar4 = ::std::
             unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ::operator->(&this->m_ssl_ctx);
    boost::asio::ssl::context::use_tmp_dh_file(pcVar4,passphrase_local,(error_code *)local_68);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_68);
    if (bVar1) {
      paVar3 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
      if (bVar1) {
        paVar3 = alerts(this);
        get_handle((torrent *)local_108);
        alert_manager::
        emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,std::__cxx11::string_const&>
                  (paVar3,(torrent_handle *)local_108,(error_code *)local_68,passphrase_local);
        torrent_handle::~torrent_handle((torrent_handle *)local_108);
      }
    }
    uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if ((uVar2 & 1) != 0) {
      boost::system::error_code::message_abi_cxx11_(&local_128,(error_code *)local_68);
      uVar5 = ::std::__cxx11::string::c_str();
      (*(this->super_request_callback)._vptr_request_callback[7])(this,"*** use DH file: %s",uVar5);
      ::std::__cxx11::string::~string((string *)&local_128);
    }
  }
  else {
    paVar3 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::torrent_error_alert>(paVar3);
    if (bVar1) {
      paVar3 = alerts(this);
      get_handle((torrent *)&stack0xffffffffffffffc0);
      local_44.m_val = 0x71;
      alert_manager::
      emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum,char_const(&)[1]>
                (paVar3,(torrent_handle *)&stack0xffffffffffffffc0,&local_44.m_val,
                 (char (*) [1])0x86a1ad);
      torrent_handle::~torrent_handle((torrent_handle *)&stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params
		, std::string const& passphrase)
	{
		if (!m_ssl_ctx)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle()
					, errors::not_an_ssl_torrent, "");
			return;
		}

		error_code ec;
		m_ssl_ctx->set_password_callback(
				[passphrase](std::size_t, ssl::context::password_purpose purpose)
				{
					return purpose == ssl::context::for_reading ? passphrase : "";
				}
				, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "");
		}
		m_ssl_ctx->use_certificate_file(certificate, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, certificate);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use certificate file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_private_key_file(private_key, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, private_key);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use private key file: %s", ec.message().c_str());
#endif
		m_ssl_ctx->use_tmp_dh_file(dh_params, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, dh_params);
		}
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** use DH file: %s", ec.message().c_str());
#endif
	}